

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O1

void __thiscall UniqueList<secplane_t>::Clear(UniqueList<secplane_t> *this)

{
  uint uVar1;
  secplane_t *psVar2;
  ulong uVar3;
  
  if ((this->Array).Count != 0) {
    uVar3 = 0;
    do {
      psVar2 = (this->Array).Array[uVar3];
      if (psVar2 != (secplane_t *)0x0) {
        operator_delete(psVar2,0x28);
      }
      uVar3 = uVar3 + 1;
      uVar1 = (this->Array).Count;
    } while (uVar3 < uVar1);
    if (uVar1 != 0) {
      (this->Array).Count = 0;
    }
  }
  return;
}

Assistant:

void Clear()
	{
		for(unsigned i=0;i<Array.Size();i++) TheFreeList.Release(Array[i]);
		Array.Clear();
	}